

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.c
# Opt level: O2

void BrotliCompressFragmentFastImpl11
               (MemoryManager *m,uint8_t *input,size_t input_size,int is_last,int *table,
               uint8_t *cmd_depth,uint16_t *cmd_bits,size_t *cmd_code_numbits,uint8_t *cmd_code,
               size_t *storage_ix,uint8_t *storage)

{
  long *data;
  byte bVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint32_t *puVar8;
  byte bVar9;
  byte bVar10;
  ulong uVar11;
  long *begin;
  uint8_t *puVar12;
  uint8_t *puVar13;
  uint8_t *puVar14;
  uint uVar15;
  long lVar16;
  size_t i;
  ulong uVar17;
  uint8_t *puVar18;
  uint8_t *puVar19;
  int iVar20;
  long *__s2;
  ulong uVar21;
  long *plVar22;
  ulong uVar23;
  char *__assertion;
  ulong uVar24;
  ulong uVar25;
  long *plVar26;
  uint8_t *puVar27;
  long *plVar28;
  long *__s1;
  bool bVar29;
  int local_5ac;
  uint8_t *local_5a0;
  ulong local_590;
  uint8_t *local_588;
  uint8_t *local_580;
  uint32_t cmd_histo [128];
  uint8_t lit_depth [256];
  uint16_t lit_bits [256];
  
  local_580 = (uint8_t *)0x18000;
  if (input_size < 0x18000) {
    local_580 = (uint8_t *)input_size;
  }
  uVar21 = *storage_ix;
  if (input_size == 0) {
    if (is_last != 0) {
      *(ulong *)(storage + (uVar21 >> 3)) = (ulong)storage[uVar21 >> 3] | 1L << ((byte)uVar21 & 7);
      uVar17 = uVar21 + 1;
      *storage_ix = uVar17;
      *(ulong *)(storage + (uVar17 >> 3)) = (ulong)storage[uVar17 >> 3] | 1L << ((byte)uVar17 & 7);
      *storage_ix = (ulong)((int)uVar21 + 9U & 0xfffffff8);
      return;
    }
    __assert_fail("is_last",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment.c"
                  ,0x1d3,
                  "void BrotliCompressFragmentFastImpl(MemoryManager *, const uint8_t *, size_t, int, int *, size_t, uint8_t *, uint16_t *, size_t *, uint8_t *, size_t *, uint8_t *)"
                 );
  }
  BrotliStoreMetaBlockHeader((size_t)local_580,0,storage_ix,storage);
  uVar17 = *storage_ix;
  uVar11 = uVar17 >> 3;
  *(ulong *)(storage + uVar11) = (ulong)storage[uVar11];
  *storage_ix = uVar17 + 0xd;
  local_590 = BuildAndStoreLiteralPrefixCode
                        (m,input,(size_t)local_580,lit_depth,lit_bits,storage_ix,storage);
  for (uVar17 = 0; uVar11 = *cmd_code_numbits, uVar17 + 7 < uVar11; uVar17 = uVar17 + 8) {
    uVar11 = *storage_ix;
    *(ulong *)(storage + (uVar11 >> 3)) =
         (ulong)cmd_code[uVar17 >> 3] << ((byte)uVar11 & 7) | (ulong)storage[uVar11 >> 3];
    *storage_ix = uVar11 + 8;
  }
  uVar5 = (uint)uVar11 & 7;
  if (cmd_code[uVar11 >> 3] >> (sbyte)uVar5 != 0) {
LAB_0011d345:
    __assertion = "(bits >> n_bits) == 0";
    uVar5 = 0x36;
LAB_0011d375:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                  ,uVar5,
                  "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)");
  }
  uVar17 = *storage_ix;
  *(ulong *)(storage + (uVar17 >> 3)) =
       (ulong)cmd_code[uVar11 >> 3] << ((byte)uVar17 & 7) | (ulong)storage[uVar17 >> 3];
  *storage_ix = uVar5 + uVar17;
  begin = (long *)input;
LAB_0011bb30:
  __s1 = begin;
  plVar26 = begin;
  local_588 = local_580;
  do {
    memcpy(cmd_histo,kCmdHistoSeed,0x200);
    data = (long *)((long)plVar26 + (long)local_580);
    if ((uint8_t *)0xf < local_580) {
      puVar14 = (uint8_t *)(input_size + -0x10);
      if (local_580 + -5 < (uint8_t *)(input_size + -0x10)) {
        puVar14 = local_580 + -5;
      }
      plVar28 = plVar26;
      local_5ac = -1;
LAB_0011bbbf:
      plVar28 = (long *)((long)plVar28 + 1);
      if (plVar28 <= __s1) {
        __assert_fail("next_emit < ip",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment.c"
                      ,0x216,
                      "void BrotliCompressFragmentFastImpl(MemoryManager *, const uint8_t *, size_t, int, int *, size_t, uint8_t *, uint16_t *, size_t *, uint8_t *, size_t *, uint8_t *)"
                     );
      }
      lVar16 = *plVar28;
      uVar17 = 0x20;
      do {
        uVar11 = (ulong)(lVar16 * 0x1e35a7bd000000) >> 0x35;
        lVar3 = *plVar28;
        if (uVar11 != (ulong)(lVar3 * 0x1e35a7bd000000) >> 0x35) {
          __assert_fail("hash == Hash(next_ip, shift)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment.c"
                        ,0x21b,
                        "void BrotliCompressFragmentFastImpl(MemoryManager *, const uint8_t *, size_t, int, int *, size_t, uint8_t *, uint16_t *, size_t *, uint8_t *, size_t *, uint8_t *)"
                       );
        }
        plVar22 = (long *)((uVar17 >> 5) + (long)plVar28);
        if (puVar14 + (long)plVar26 < plVar22) break;
        lVar16 = *plVar22;
        iVar7 = (int)input;
        if (((*(int *)((long)plVar28 + -(long)local_5ac) == (int)lVar3) &&
            (__s2 = (long *)((long)plVar28 + -(long)local_5ac),
            *(char *)((long)__s2 + 4) == (char)((ulong)lVar3 >> 0x20))) && (0 < local_5ac)) {
          table[uVar11] = (int)plVar28 - iVar7;
LAB_0011bc3a:
          if ((long)plVar28 - (long)__s2 < 0x3fff1) goto LAB_0011bc8a;
        }
        else {
          if ((long)table[uVar11] < 0) {
            __assert_fail("candidate >= base_ip",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment.c"
                          ,0x22a,
                          "void BrotliCompressFragmentFastImpl(MemoryManager *, const uint8_t *, size_t, int, int *, size_t, uint8_t *, uint16_t *, size_t *, uint8_t *, size_t *, uint8_t *)"
                         );
          }
          __s2 = (long *)(input + table[uVar11]);
          if (plVar28 <= __s2) {
            __assert_fail("candidate < ip",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment.c"
                          ,0x22b,
                          "void BrotliCompressFragmentFastImpl(MemoryManager *, const uint8_t *, size_t, int, int *, size_t, uint8_t *, uint16_t *, size_t *, uint8_t *, size_t *, uint8_t *)"
                         );
          }
          table[uVar11] = (int)plVar28 - iVar7;
          if (((int)*plVar28 == (int)*__s2) &&
             (*(char *)((long)plVar28 + 4) == *(char *)((long)__s2 + 4))) goto LAB_0011bc3a;
        }
        uVar17 = (ulong)((int)uVar17 + 1);
        plVar28 = plVar22;
      } while( true );
    }
LAB_0011cc1f:
    if (data < __s1) {
      __assert_fail("next_emit <= ip_end",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment.c"
                    ,0x29f,
                    "void BrotliCompressFragmentFastImpl(MemoryManager *, const uint8_t *, size_t, int, int *, size_t, uint8_t *, uint16_t *, size_t *, uint8_t *, size_t *, uint8_t *)"
                   );
    }
    input_size = input_size + -(long)local_580;
    puVar14 = (uint8_t *)0x10000;
    local_580 = (uint8_t *)0x10000;
    if (input_size < (uint8_t *)0x10000) {
      local_580 = (uint8_t *)input_size;
    }
    if ((((uint8_t *)input_size == (uint8_t *)0x0) ||
        (puVar12 = local_580 + (long)local_588, "\x7fELF\x02\x01\x01" < puVar12)) ||
       (iVar7 = ShouldMergeBlock((uint8_t *)data,(size_t)local_580,lit_depth), iVar7 == 0))
    goto LAB_0011ccc2;
    if (local_588 < (uint8_t *)0x10001) {
      __assert_fail("total_block_size > (1 << 16)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment.c"
                    ,0x2a9,
                    "void BrotliCompressFragmentFastImpl(MemoryManager *, const uint8_t *, size_t, int, int *, size_t, uint8_t *, uint16_t *, size_t *, uint8_t *, size_t *, uint8_t *)"
                   );
    }
    UpdateBits((ulong)((int)puVar12 - 1),(int)uVar21 + 3,(size_t)storage,puVar14);
    plVar26 = data;
    local_588 = puVar12;
  } while( true );
LAB_0011bc8a:
  puVar27 = (uint8_t *)((long)data + (-5 - (long)plVar28));
  puVar12 = (uint8_t *)((ulong)puVar27 & 0xfffffffffffffff8);
  uVar17 = 0;
  lVar16 = 0;
LAB_0011bcad:
  if ((ulong)puVar27 >> 3 == uVar17) {
    uVar17 = (ulong)((uint)puVar27 & 7);
    puVar19 = (uint8_t *)((long)plVar28 + (5 - lVar16));
    for (; (bVar29 = uVar17 != 0, uVar17 = uVar17 - 1, puVar18 = puVar27, bVar29 &&
           (puVar18 = puVar12, *(uint8_t *)((long)__s2 + (long)(puVar12 + 5)) == *puVar19));
        puVar12 = puVar12 + 1) {
      puVar19 = puVar19 + 1;
    }
  }
  else {
    uVar11 = *(ulong *)((long)plVar28 + uVar17 * 8 + 5);
    uVar25 = *(ulong *)((long)__s2 + uVar17 * 8 + 5);
    if (uVar11 == uVar25) goto code_r0x0011bcc4;
    uVar25 = uVar25 ^ uVar11;
    uVar17 = 0;
    if (uVar25 != 0) {
      for (; (uVar25 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
      }
    }
    puVar18 = (uint8_t *)((uVar17 >> 3 & 0x1fffffff) - lVar16);
  }
  puVar12 = puVar18 + 5;
  iVar6 = bcmp(plVar28,__s2,(size_t)puVar12);
  if (iVar6 != 0) {
    __assert_fail("0 == memcmp(base, candidate, matched)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment.c"
                  ,0x242,
                  "void BrotliCompressFragmentFastImpl(MemoryManager *, const uint8_t *, size_t, int, int *, size_t, uint8_t *, uint16_t *, size_t *, uint8_t *, size_t *, uint8_t *)"
                 );
  }
  uVar17 = (long)plVar28 - (long)__s1;
  if (0x1841 < uVar17) {
    uVar11 = ((long)__s1 - (long)begin) * 0x32;
    if ((uVar11 < uVar17 || uVar11 - uVar17 == 0) && (0x3d4 < local_590)) {
      EmitUncompressedMetaBlock((uint8_t *)begin,(uint8_t *)plVar28,uVar21,storage_ix,storage);
      local_5a0 = (uint8_t *)((long)plVar26 + (input_size - (long)plVar28));
      goto LAB_0011d04d;
    }
    if (uVar17 < 0x5842) {
      bVar1 = cmd_depth[0x3e];
      if (cmd_bits[0x3e] >> (bVar1 & 0x3f) != 0) goto LAB_0011d345;
      if (0x38 < bVar1) goto LAB_0011d35e;
      uVar23 = *storage_ix;
      uVar11 = uVar23 + bVar1;
      uVar25 = uVar23 + bVar1 + 0xe;
      *(ulong *)(storage + (uVar23 >> 3)) =
           (ulong)cmd_bits[0x3e] << ((byte)uVar23 & 7) | (ulong)storage[uVar23 >> 3];
      *storage_ix = uVar11;
      *(ulong *)(storage + (uVar11 >> 3)) =
           uVar17 - 0x1842 << ((byte)uVar11 & 7) | (ulong)storage[uVar11 >> 3];
      *storage_ix = uVar25;
      puVar8 = cmd_histo + 0x16;
    }
    else {
      bVar1 = cmd_depth[0x3f];
      if (cmd_bits[0x3f] >> (bVar1 & 0x3f) != 0) goto LAB_0011d345;
      if (0x38 < bVar1) goto LAB_0011d35e;
      uVar11 = *storage_ix;
      uVar25 = bVar1 + uVar11;
      *(ulong *)(storage + (uVar11 >> 3)) =
           (ulong)cmd_bits[0x3f] << ((byte)uVar11 & 7) | (ulong)storage[uVar11 >> 3];
      *storage_ix = uVar25;
      if (0xffffff < uVar17 - 0x5842) goto LAB_0011d345;
      *(ulong *)(storage + (uVar25 >> 3)) =
           uVar17 - 0x5842 << ((byte)uVar25 & 7) | (ulong)storage[uVar25 >> 3];
      uVar25 = uVar25 + 0x18;
      *storage_ix = uVar25;
      puVar8 = cmd_histo + 0x17;
    }
    goto LAB_0011bfa2;
  }
  if (uVar17 < 6) {
    bVar1 = cmd_depth[uVar17 + 0x28];
    if (cmd_bits[uVar17 + 0x28] >> (bVar1 & 0x3f) != 0) goto LAB_0011d345;
    if (0x38 < bVar1) goto LAB_0011d35e;
    uVar11 = uVar17 | 0x28;
    uVar23 = *storage_ix;
    uVar25 = bVar1 + uVar23;
    *(ulong *)(storage + (uVar23 >> 3)) =
         (ulong)cmd_bits[uVar17 + 0x28] << ((byte)uVar23 & 7) | (ulong)storage[uVar23 >> 3];
  }
  else {
    if (uVar17 < 0x82) {
      uVar11 = uVar17 - 2;
      uVar5 = 0x1f;
      if ((uint)uVar11 != 0) {
        for (; (uint)uVar11 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      uVar5 = (uVar5 ^ 0xffffffe0) + 0x1f;
      uVar23 = (ulong)uVar5;
      bVar10 = (byte)uVar5;
      uVar24 = uVar11 >> (bVar10 & 0x3f);
      lVar16 = uVar24 + uVar23 * 2;
      bVar1 = cmd_depth[lVar16 + 0x2a];
      if (cmd_bits[lVar16 + 0x2a] >> (bVar1 & 0x3f) != 0) goto LAB_0011d345;
      if (0x38 < bVar1) goto LAB_0011d35e;
      uVar4 = *storage_ix;
      uVar25 = bVar1 + uVar4;
      *(ulong *)(storage + (uVar4 >> 3)) =
           (ulong)cmd_bits[lVar16 + 0x2a] << ((byte)uVar4 & 7) | (ulong)storage[uVar4 >> 3];
      *storage_ix = uVar25;
      uVar11 = uVar11 - (uVar24 << (bVar10 & 0x3f));
      if (uVar11 >> (bVar10 & 0x3f) != 0) goto LAB_0011d345;
      *(ulong *)(storage + (uVar25 >> 3)) =
           uVar11 << ((byte)uVar25 & 7) | (ulong)storage[uVar25 >> 3];
      uVar25 = uVar25 + uVar23;
      *storage_ix = uVar25;
      puVar8 = cmd_histo + uVar24 + uVar23 * 2 + 0x2a;
      goto LAB_0011bfa2;
    }
    if (0x841 < uVar17) {
      bVar1 = cmd_depth[0x3d];
      if (cmd_bits[0x3d] >> (bVar1 & 0x3f) != 0) goto LAB_0011d345;
      if (0x38 < bVar1) goto LAB_0011d35e;
      uVar23 = *storage_ix;
      uVar11 = uVar23 + bVar1;
      uVar25 = uVar23 + bVar1 + 0xc;
      *(ulong *)(storage + (uVar23 >> 3)) =
           (ulong)cmd_bits[0x3d] << ((byte)uVar23 & 7) | (ulong)storage[uVar23 >> 3];
      *storage_ix = uVar11;
      *(ulong *)(storage + (uVar11 >> 3)) =
           uVar17 - 0x842 << ((byte)uVar11 & 7) | (ulong)storage[uVar11 >> 3];
      *storage_ix = uVar25;
      puVar8 = cmd_histo + 0x15;
      goto LAB_0011bfa2;
    }
    uVar5 = 0x1f;
    uVar15 = (uint)(uVar17 - 0x42);
    if (uVar15 != 0) {
      for (; uVar15 >> uVar5 == 0; uVar5 = uVar5 - 1) {
      }
    }
    uVar11 = 0x51 - (ulong)(uVar5 ^ 0x1f);
    bVar1 = cmd_depth[uVar11];
    if (cmd_bits[uVar11] >> (bVar1 & 0x3f) != 0) goto LAB_0011d345;
    if (0x38 < bVar1) goto LAB_0011d35e;
    uVar23 = *storage_ix;
    uVar25 = bVar1 + uVar23;
    *(ulong *)(storage + (uVar23 >> 3)) =
         (ulong)cmd_bits[uVar11] << ((byte)uVar23 & 7) | (ulong)storage[uVar23 >> 3];
    *storage_ix = uVar25;
    uVar23 = (-1L << ((byte)uVar5 & 0x3f)) + (uVar17 - 0x42);
    if (uVar23 >> ((byte)uVar5 & 0x3f) != 0) goto LAB_0011d345;
    *(ulong *)(storage + (uVar25 >> 3)) = uVar23 << ((byte)uVar25 & 7) | (ulong)storage[uVar25 >> 3]
    ;
    uVar25 = uVar5 + uVar25;
  }
  *storage_ix = uVar25;
  puVar8 = cmd_histo + uVar11;
LAB_0011bfa2:
  *puVar8 = *puVar8 + 1;
  for (uVar11 = 0; bVar1 = (byte)uVar25, uVar17 != uVar11; uVar11 = uVar11 + 1) {
    bVar10 = lit_depth[*(byte *)((long)__s1 + uVar11)];
    if (lit_bits[*(byte *)((long)__s1 + uVar11)] >> (bVar10 & 0x3f) != 0) goto LAB_0011d345;
    if (0x38 < bVar10) goto LAB_0011d35e;
    *(ulong *)(storage + (uVar25 >> 3)) =
         (ulong)lit_bits[*(byte *)((long)__s1 + uVar11)] << (bVar1 & 7) |
         (ulong)storage[uVar25 >> 3];
    uVar25 = uVar25 + bVar10;
    *storage_ix = uVar25;
  }
  iVar6 = (int)((long)plVar28 - (long)__s2);
  if (local_5ac == iVar6) {
    bVar10 = cmd_depth[0x40];
    if (cmd_bits[0x40] >> (bVar10 & 0x3f) != 0) goto LAB_0011d345;
    if (0x38 < bVar10) goto LAB_0011d35e;
    *(ulong *)(storage + (uVar25 >> 3)) =
         (ulong)cmd_bits[0x40] << (bVar1 & 7) | (ulong)storage[uVar25 >> 3];
    uVar25 = bVar10 + uVar25;
    *storage_ix = uVar25;
    cmd_histo[0x40] = cmd_histo[0x40] + 1;
    iVar6 = local_5ac;
  }
  else {
    uVar17 = (long)iVar6 + 3;
    uVar5 = 0x1f;
    if ((uint)uVar17 != 0) {
      for (; (uint)uVar17 >> uVar5 == 0; uVar5 = uVar5 - 1) {
      }
    }
    uVar15 = 0x1e - (uVar5 ^ 0x1f);
    uVar11 = (ulong)((uVar17 >> ((ulong)uVar15 & 0x3f) & 1) != 0);
    uVar23 = ((uVar5 ^ 0x1f) * 2 ^ 0x3e) - 4 | uVar11;
    bVar10 = cmd_depth[uVar23 + 0x50];
    if (cmd_bits[uVar23 + 0x50] >> (bVar10 & 0x3f) != 0) goto LAB_0011d345;
    if (0x38 < bVar10) goto LAB_0011d35e;
    *(ulong *)(storage + (uVar25 >> 3)) =
         (ulong)cmd_bits[uVar23 + 0x50] << (bVar1 & 7) | (ulong)storage[uVar25 >> 3];
    uVar25 = bVar10 + uVar25;
    *storage_ix = uVar25;
    uVar17 = uVar17 - (uVar11 + 2 << ((byte)uVar15 & 0x3f));
    if (uVar17 >> ((byte)uVar15 & 0x3f) != 0) goto LAB_0011d345;
    if (0x38 < uVar15) goto LAB_0011d35e;
    *(ulong *)(storage + (uVar25 >> 3)) = uVar17 << ((byte)uVar25 & 7) | (ulong)storage[uVar25 >> 3]
    ;
    uVar25 = uVar15 + uVar25;
    *storage_ix = uVar25;
    cmd_histo[uVar23 + 0x50] = cmd_histo[uVar23 + 0x50] + 1;
  }
  bVar1 = (byte)uVar25;
  if (puVar12 < (uint8_t *)0xc) {
    bVar10 = cmd_depth[(long)(puVar18 + 1)];
    if (cmd_bits[(long)(puVar18 + 1)] >> (bVar10 & 0x3f) != 0) goto LAB_0011d345;
    if (0x38 < bVar10) goto LAB_0011d35e;
    *(ulong *)(storage + (uVar25 >> 3)) =
         (ulong)cmd_bits[(long)(puVar18 + 1)] << (bVar1 & 7) | (ulong)storage[uVar25 >> 3];
    *storage_ix = bVar10 + uVar25;
    puVar8 = cmd_histo + (long)(puVar18 + 1);
  }
  else if (puVar12 < (uint8_t *)0x48) {
    puVar12 = puVar18 + -3;
    uVar5 = 0x1f;
    if ((uint)puVar12 != 0) {
      for (; (uint)puVar12 >> uVar5 == 0; uVar5 = uVar5 - 1) {
      }
    }
    uVar5 = (uVar5 ^ 0xffffffe0) + 0x1f;
    uVar17 = (ulong)uVar5;
    bVar9 = (byte)uVar5;
    uVar11 = (ulong)puVar12 >> (bVar9 & 0x3f);
    lVar16 = uVar11 + uVar17 * 2;
    bVar10 = cmd_depth[lVar16 + 4];
    if (cmd_bits[lVar16 + 4] >> (bVar10 & 0x3f) != 0) goto LAB_0011d345;
    if (0x38 < bVar10) goto LAB_0011d35e;
    *(ulong *)(storage + (uVar25 >> 3)) =
         (ulong)cmd_bits[lVar16 + 4] << (bVar1 & 7) | (ulong)storage[uVar25 >> 3];
    uVar25 = bVar10 + uVar25;
    *storage_ix = uVar25;
    uVar23 = (long)puVar12 - (uVar11 << (bVar9 & 0x3f));
    if (uVar23 >> (bVar9 & 0x3f) != 0) goto LAB_0011d345;
    *(ulong *)(storage + (uVar25 >> 3)) = uVar23 << ((byte)uVar25 & 7) | (ulong)storage[uVar25 >> 3]
    ;
    *storage_ix = uVar25 + uVar17;
    puVar8 = cmd_histo + uVar11 + uVar17 * 2 + 4;
  }
  else {
    if (puVar12 < (uint8_t *)0x88) {
      uVar17 = (ulong)(puVar18 + -3) >> 5;
      bVar10 = cmd_depth[uVar17 + 0x1e];
      if (cmd_bits[uVar17 + 0x1e] >> (bVar10 & 0x3f) != 0) goto LAB_0011d345;
      if (0x38 < bVar10) goto LAB_0011d35e;
      *(ulong *)(storage + (uVar25 >> 3)) =
           (ulong)cmd_bits[uVar17 + 0x1e] << (bVar1 & 7) | (ulong)storage[uVar25 >> 3];
      uVar11 = uVar25 + bVar10;
      *storage_ix = uVar11;
      *(ulong *)(storage + (uVar11 >> 3)) =
           (ulong)((uint)(puVar18 + -3) & 0x1f) << ((byte)uVar11 & 7) | (ulong)storage[uVar11 >> 3];
      uVar11 = uVar25 + bVar10 + 5;
      *storage_ix = uVar11;
      bVar1 = cmd_depth[0x40];
      if (cmd_bits[0x40] >> (bVar1 & 0x3f) != 0) goto LAB_0011d345;
      if (0x38 < bVar1) goto LAB_0011d35e;
      *(ulong *)(storage + (uVar11 >> 3)) =
           (ulong)cmd_bits[0x40] << ((byte)uVar11 & 7) | (ulong)storage[uVar11 >> 3];
      *storage_ix = bVar1 + uVar11;
      cmd_histo[uVar17 + 0x1e] = cmd_histo[uVar17 + 0x1e] + 1;
    }
    else if (puVar12 < (uint8_t *)0x848) {
      puVar12 = puVar18 + -0x43;
      uVar5 = 0x1f;
      if ((uint)puVar12 != 0) {
        for (; (uint)puVar12 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      lVar16 = 0x3b - (ulong)(uVar5 ^ 0x1f);
      bVar10 = cmd_depth[lVar16];
      if (cmd_bits[lVar16] >> (bVar10 & 0x3f) != 0) goto LAB_0011d345;
      if (0x38 < bVar10) goto LAB_0011d35e;
      *(ulong *)(storage + (uVar25 >> 3)) =
           (ulong)cmd_bits[lVar16] << (bVar1 & 7) | (ulong)storage[uVar25 >> 3];
      uVar25 = bVar10 + uVar25;
      *storage_ix = uVar25;
      if ((ulong)(puVar12 + (-1L << ((byte)uVar5 & 0x3f))) >> ((byte)uVar5 & 0x3f) != 0)
      goto LAB_0011d345;
      *(ulong *)(storage + (uVar25 >> 3)) =
           (long)(puVar12 + (-1L << ((byte)uVar5 & 0x3f))) << ((byte)uVar25 & 7) |
           (ulong)storage[uVar25 >> 3];
      uVar25 = uVar5 + uVar25;
      *storage_ix = uVar25;
      bVar1 = cmd_depth[0x40];
      if (cmd_bits[0x40] >> (bVar1 & 0x3f) != 0) goto LAB_0011d345;
      if (0x38 < bVar1) goto LAB_0011d35e;
      *(ulong *)(storage + (uVar25 >> 3)) =
           (ulong)cmd_bits[0x40] << ((byte)uVar25 & 7) | (ulong)storage[uVar25 >> 3];
      *storage_ix = bVar1 + uVar25;
      cmd_histo[lVar16] = cmd_histo[lVar16] + 1;
    }
    else {
      bVar10 = cmd_depth[0x27];
      if (cmd_bits[0x27] >> (bVar10 & 0x3f) != 0) goto LAB_0011d345;
      if (0x38 < bVar10) goto LAB_0011d35e;
      *(ulong *)(storage + (uVar25 >> 3)) =
           (ulong)cmd_bits[0x27] << (bVar1 & 7) | (ulong)storage[uVar25 >> 3];
      uVar25 = bVar10 + uVar25;
      *storage_ix = uVar25;
      if ((uint8_t *)0xffffff < puVar18 + -0x843) goto LAB_0011d345;
      bVar10 = (byte)uVar25 & 7;
      *(ulong *)(storage + (uVar25 >> 3)) =
           (long)(puVar18 + -0x843) << bVar10 | (ulong)storage[uVar25 >> 3];
      uVar25 = uVar25 + 0x18;
      *storage_ix = uVar25;
      bVar1 = cmd_depth[0x40];
      if (cmd_bits[0x40] >> (bVar1 & 0x3f) != 0) goto LAB_0011d345;
      if (0x38 < bVar1) goto LAB_0011d35e;
      *(ulong *)(storage + (uVar25 >> 3)) =
           (ulong)cmd_bits[0x40] << bVar10 | (ulong)storage[uVar25 >> 3];
      *storage_ix = bVar1 + uVar25;
      cmd_histo[0x2f] = cmd_histo[0x2f] + 1;
    }
    puVar8 = cmd_histo + 0x40;
  }
  *puVar8 = *puVar8 + 1;
  __s1 = (long *)((long)plVar28 + (long)(puVar18 + 5));
  while( true ) {
    if (puVar14 + (long)plVar26 <= __s1) goto LAB_0011cc1f;
    uVar17 = *(ulong *)((long)__s1 + -3);
    uVar11 = (uVar17 >> 0x18) * 0x1e35a7bd000000 >> 0x35;
    iVar20 = (int)__s1 - iVar7;
    table[uVar17 * 0x1e35a7bd000000 >> 0x35] = iVar20 + -3;
    table[(uVar17 >> 8) * 0x1e35a7bd000000 >> 0x35] = iVar20 + -2;
    table[(uVar17 >> 0x10) * 0x1e35a7bd000000 >> 0x35] = iVar20 + -1;
    iVar2 = table[uVar11];
    table[uVar11] = iVar20;
    puVar12 = input + iVar2;
    plVar28 = __s1;
    local_5ac = iVar6;
    if (((int)*__s1 != *(int *)(input + iVar2)) || (*(uint8_t *)((long)__s1 + 4) != puVar12[4]))
    break;
    puVar18 = (uint8_t *)((long)data + (-5 - (long)__s1));
    puVar27 = (uint8_t *)((ulong)puVar18 & 0xfffffffffffffff8);
    uVar17 = 0;
    lVar16 = 0;
LAB_0011c66c:
    if ((ulong)puVar18 >> 3 == uVar17) {
      uVar17 = (ulong)((uint)puVar18 & 7);
      puVar13 = (uint8_t *)((long)__s1 + (5 - lVar16));
      for (; (bVar29 = uVar17 != 0, uVar17 = uVar17 - 1, puVar19 = puVar18, bVar29 &&
             (puVar19 = puVar27, puVar12[(long)(puVar27 + 5)] == *puVar13)); puVar27 = puVar27 + 1)
      {
        puVar13 = puVar13 + 1;
      }
    }
    else {
      uVar11 = *(ulong *)((long)__s1 + uVar17 * 8 + 5);
      if (uVar11 == *(ulong *)(puVar12 + uVar17 * 8 + 5)) goto code_r0x0011c682;
      uVar11 = *(ulong *)(puVar12 + uVar17 * 8 + 5) ^ uVar11;
      uVar17 = 0;
      if (uVar11 != 0) {
        for (; (uVar11 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
        }
      }
      puVar19 = (uint8_t *)((uVar17 >> 3 & 0x1fffffff) - lVar16);
    }
    puVar27 = puVar19 + 5;
    if (0x3fff0 < (long)__s1 - (long)puVar12) break;
    iVar6 = bcmp(__s1,puVar12,(size_t)puVar27);
    if (iVar6 != 0) {
      __assert_fail("0 == memcmp(base, candidate, matched)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment.c"
                    ,0x27e,
                    "void BrotliCompressFragmentFastImpl(MemoryManager *, const uint8_t *, size_t, int, int *, size_t, uint8_t *, uint16_t *, size_t *, uint8_t *, size_t *, uint8_t *)"
                   );
    }
    if (puVar27 < (uint8_t *)0xa) {
      bVar1 = cmd_depth[(long)(puVar19 + 0x13)];
      if (cmd_bits[(long)(puVar19 + 0x13)] >> (bVar1 & 0x3f) != 0) goto LAB_0011d345;
      if (0x38 < bVar1) goto LAB_0011d35e;
      uVar17 = *storage_ix;
      uVar11 = bVar1 + uVar17;
      *(ulong *)(storage + (uVar17 >> 3)) =
           (ulong)cmd_bits[(long)(puVar19 + 0x13)] << ((byte)uVar17 & 7) |
           (ulong)storage[uVar17 >> 3];
      *storage_ix = uVar11;
      puVar8 = cmd_histo + (long)(puVar19 + 0x13);
    }
    else {
      if (puVar27 < (uint8_t *)0x86) {
        puVar19 = puVar19 + -1;
        uVar5 = 0x1f;
        if ((uint)puVar19 != 0) {
          for (; (uint)puVar19 >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
        }
        uVar5 = (uVar5 ^ 0xffffffe0) + 0x1f;
        uVar25 = (ulong)uVar5;
        bVar10 = (byte)uVar5;
        uVar17 = (ulong)puVar19 >> (bVar10 & 0x3f);
        lVar16 = uVar17 + uVar25 * 2;
        bVar1 = cmd_depth[lVar16 + 0x14];
        if (cmd_bits[lVar16 + 0x14] >> (bVar1 & 0x3f) != 0) goto LAB_0011d345;
        if (0x38 < bVar1) goto LAB_0011d35e;
        uVar23 = *storage_ix;
        uVar11 = bVar1 + uVar23;
        *(ulong *)(storage + (uVar23 >> 3)) =
             (ulong)cmd_bits[lVar16 + 0x14] << ((byte)uVar23 & 7) | (ulong)storage[uVar23 >> 3];
        *storage_ix = uVar11;
        uVar23 = (long)puVar19 - (uVar17 << (bVar10 & 0x3f));
        if (uVar23 >> (bVar10 & 0x3f) != 0) goto LAB_0011d345;
        lVar16 = uVar17 + uVar25 * 2 + 0x14;
        *(ulong *)(storage + (uVar11 >> 3)) =
             uVar23 << ((byte)uVar11 & 7) | (ulong)storage[uVar11 >> 3];
      }
      else {
        if ((uint8_t *)0x845 < puVar27) {
          bVar1 = cmd_depth[0x27];
          if (cmd_bits[0x27] >> (bVar1 & 0x3f) == 0) {
            if (bVar1 < 0x39) {
              uVar17 = *storage_ix;
              uVar11 = bVar1 + uVar17;
              *(ulong *)(storage + (uVar17 >> 3)) =
                   (ulong)cmd_bits[0x27] << ((byte)uVar17 & 7) | (ulong)storage[uVar17 >> 3];
              *storage_ix = uVar11;
              if (puVar19 + -0x841 < (uint8_t *)0x1000000) {
                *(ulong *)(storage + (uVar11 >> 3)) =
                     (long)(puVar19 + -0x841) << ((byte)uVar11 & 7) | (ulong)storage[uVar11 >> 3];
                uVar11 = uVar11 + 0x18;
                *storage_ix = uVar11;
                puVar8 = cmd_histo + 0x2f;
                goto LAB_0011c951;
              }
              goto LAB_0011d345;
            }
            goto LAB_0011d35e;
          }
          goto LAB_0011d345;
        }
        puVar19 = puVar19 + -0x41;
        uVar5 = 0x1f;
        if ((uint)puVar19 != 0) {
          for (; (uint)puVar19 >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
        }
        lVar16 = 0x3b - (ulong)(uVar5 ^ 0x1f);
        bVar1 = cmd_depth[lVar16];
        if (cmd_bits[lVar16] >> (bVar1 & 0x3f) != 0) goto LAB_0011d345;
        if (0x38 < bVar1) goto LAB_0011d35e;
        uVar17 = *storage_ix;
        uVar25 = bVar1 + uVar17;
        *(ulong *)(storage + (uVar17 >> 3)) =
             (ulong)cmd_bits[lVar16] << ((byte)uVar17 & 7) | (ulong)storage[uVar17 >> 3];
        *storage_ix = uVar25;
        if ((ulong)(puVar19 + (-1L << ((byte)uVar5 & 0x3f))) >> ((byte)uVar5 & 0x3f) != 0)
        goto LAB_0011d345;
        uVar11 = (ulong)uVar5;
        *(ulong *)(storage + (uVar25 >> 3)) =
             (long)(puVar19 + (-1L << ((byte)uVar5 & 0x3f))) << ((byte)uVar25 & 7) |
             (ulong)storage[uVar25 >> 3];
      }
      uVar11 = uVar11 + uVar25;
      *storage_ix = uVar11;
      puVar8 = cmd_histo + lVar16;
    }
LAB_0011c951:
    *puVar8 = *puVar8 + 1;
    iVar6 = (int)((long)__s1 - (long)puVar12);
    uVar17 = (long)iVar6 + 3;
    uVar5 = 0x1f;
    if ((uint)uVar17 != 0) {
      for (; (uint)uVar17 >> uVar5 == 0; uVar5 = uVar5 - 1) {
      }
    }
    uVar15 = 0x1e - (uVar5 ^ 0x1f);
    uVar25 = (ulong)((uVar17 >> ((ulong)uVar15 & 0x3f) & 1) != 0);
    uVar23 = ((uVar5 ^ 0x1f) * 2 ^ 0x3e) - 4 | uVar25;
    bVar1 = cmd_depth[uVar23 + 0x50];
    if (cmd_bits[uVar23 + 0x50] >> (bVar1 & 0x3f) != 0) goto LAB_0011d345;
    if (0x38 < bVar1) goto LAB_0011d35e;
    *(ulong *)(storage + (uVar11 >> 3)) =
         (ulong)cmd_bits[uVar23 + 0x50] << ((byte)uVar11 & 7) | (ulong)storage[uVar11 >> 3];
    uVar11 = bVar1 + uVar11;
    *storage_ix = uVar11;
    uVar17 = uVar17 - (uVar25 + 2 << ((byte)uVar15 & 0x3f));
    if (uVar17 >> ((byte)uVar15 & 0x3f) != 0) goto LAB_0011d345;
    if (0x38 < uVar15) goto LAB_0011d35e;
    *(ulong *)(storage + (uVar11 >> 3)) = uVar17 << ((byte)uVar11 & 7) | (ulong)storage[uVar11 >> 3]
    ;
    *storage_ix = uVar15 + uVar11;
    cmd_histo[uVar23 + 0x50] = cmd_histo[uVar23 + 0x50] + 1;
    __s1 = (long *)((long)__s1 + (long)puVar27);
  }
  goto LAB_0011bbbf;
code_r0x0011bcc4:
  lVar16 = lVar16 + -8;
  uVar17 = uVar17 + 1;
  goto LAB_0011bcad;
code_r0x0011c682:
  lVar16 = lVar16 + -8;
  uVar17 = uVar17 + 1;
  goto LAB_0011c66c;
LAB_0011ccc2:
  plVar28 = data;
  local_5a0 = (uint8_t *)input_size;
  if (data <= __s1) goto LAB_0011d04d;
  uVar17 = (long)data - (long)__s1;
  if (0x1841 < uVar17) {
    uVar11 = ((long)__s1 - (long)begin) * 0x32;
    if ((uVar11 < uVar17 || uVar11 - uVar17 == 0) && (0x3d4 < local_590)) {
      EmitUncompressedMetaBlock((uint8_t *)begin,(uint8_t *)data,uVar21,storage_ix,storage);
    }
    else {
      if (uVar17 < 0x5842) {
        bVar1 = cmd_depth[0x3e];
        if (cmd_bits[0x3e] >> (bVar1 & 0x3f) != 0) goto LAB_0011d345;
        if (0x38 < bVar1) {
LAB_0011d35e:
          __assertion = "n_bits <= 56";
          uVar5 = 0x37;
          goto LAB_0011d375;
        }
        uVar25 = *storage_ix;
        uVar21 = uVar25 + bVar1;
        uVar11 = uVar25 + bVar1 + 0xe;
        *(ulong *)(storage + (uVar25 >> 3)) =
             (ulong)cmd_bits[0x3e] << ((byte)uVar25 & 7) | (ulong)storage[uVar25 >> 3];
        *storage_ix = uVar21;
        *(ulong *)(storage + (uVar21 >> 3)) =
             uVar17 - 0x1842 << ((byte)uVar21 & 7) | (ulong)storage[uVar21 >> 3];
        puVar8 = cmd_histo + 0x16;
      }
      else {
        bVar1 = cmd_depth[0x3f];
        if (cmd_bits[0x3f] >> (bVar1 & 0x3f) != 0) goto LAB_0011d345;
        if (0x38 < bVar1) goto LAB_0011d35e;
        uVar21 = *storage_ix;
        uVar11 = bVar1 + uVar21;
        *(ulong *)(storage + (uVar21 >> 3)) =
             (ulong)cmd_bits[0x3f] << ((byte)uVar21 & 7) | (ulong)storage[uVar21 >> 3];
        *storage_ix = uVar11;
        if (0xffffff < uVar17 - 0x5842) goto LAB_0011d345;
        *(ulong *)(storage + (uVar11 >> 3)) =
             uVar17 - 0x5842 << ((byte)uVar11 & 7) | (ulong)storage[uVar11 >> 3];
        uVar11 = uVar11 + 0x18;
        puVar8 = cmd_histo + 0x17;
      }
      *storage_ix = uVar11;
      *puVar8 = *puVar8 + 1;
      for (uVar21 = 0; uVar17 != uVar21; uVar21 = uVar21 + 1) {
        bVar1 = lit_depth[*(byte *)((long)__s1 + uVar21)];
        if (lit_bits[*(byte *)((long)__s1 + uVar21)] >> (bVar1 & 0x3f) != 0) goto LAB_0011d345;
        if (0x38 < bVar1) goto LAB_0011d35e;
        *(ulong *)(storage + (uVar11 >> 3)) =
             (ulong)lit_bits[*(byte *)((long)__s1 + uVar21)] << ((byte)uVar11 & 7) |
             (ulong)storage[uVar11 >> 3];
        uVar11 = uVar11 + bVar1;
        *storage_ix = uVar11;
      }
    }
    goto LAB_0011d04d;
  }
  if (uVar17 < 6) {
    bVar1 = cmd_depth[uVar17 + 0x28];
    if (cmd_bits[uVar17 + 0x28] >> (bVar1 & 0x3f) != 0) goto LAB_0011d345;
    if (0x38 < bVar1) goto LAB_0011d35e;
    uVar21 = uVar17 | 0x28;
    uVar11 = *storage_ix;
    uVar25 = bVar1 + uVar11;
    *(ulong *)(storage + (uVar11 >> 3)) =
         (ulong)cmd_bits[uVar17 + 0x28] << ((byte)uVar11 & 7) | (ulong)storage[uVar11 >> 3];
LAB_0011cd4b:
    *storage_ix = uVar25;
    puVar8 = cmd_histo + uVar21;
  }
  else if (uVar17 < 0x82) {
    uVar21 = uVar17 - 2;
    uVar5 = 0x1f;
    if ((uint)uVar21 != 0) {
      for (; (uint)uVar21 >> uVar5 == 0; uVar5 = uVar5 - 1) {
      }
    }
    uVar5 = (uVar5 ^ 0xffffffe0) + 0x1f;
    uVar11 = (ulong)uVar5;
    bVar10 = (byte)uVar5;
    uVar23 = uVar21 >> (bVar10 & 0x3f);
    lVar16 = uVar23 + uVar11 * 2;
    bVar1 = cmd_depth[lVar16 + 0x2a];
    if (cmd_bits[lVar16 + 0x2a] >> (bVar1 & 0x3f) != 0) goto LAB_0011d345;
    if (0x38 < bVar1) goto LAB_0011d35e;
    uVar24 = *storage_ix;
    uVar25 = bVar1 + uVar24;
    *(ulong *)(storage + (uVar24 >> 3)) =
         (ulong)cmd_bits[lVar16 + 0x2a] << ((byte)uVar24 & 7) | (ulong)storage[uVar24 >> 3];
    *storage_ix = uVar25;
    uVar21 = uVar21 - (uVar23 << (bVar10 & 0x3f));
    if (uVar21 >> (bVar10 & 0x3f) != 0) goto LAB_0011d345;
    *(ulong *)(storage + (uVar25 >> 3)) = uVar21 << ((byte)uVar25 & 7) | (ulong)storage[uVar25 >> 3]
    ;
    uVar25 = uVar25 + uVar11;
    *storage_ix = uVar25;
    puVar8 = cmd_histo + uVar23 + uVar11 * 2 + 0x2a;
  }
  else {
    if (uVar17 < 0x842) {
      uVar5 = 0x1f;
      uVar15 = (uint)(uVar17 - 0x42);
      if (uVar15 != 0) {
        for (; uVar15 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      uVar21 = 0x51 - (ulong)(uVar5 ^ 0x1f);
      bVar1 = cmd_depth[uVar21];
      if (cmd_bits[uVar21] >> (bVar1 & 0x3f) != 0) goto LAB_0011d345;
      if (0x38 < bVar1) goto LAB_0011d35e;
      uVar11 = *storage_ix;
      uVar25 = bVar1 + uVar11;
      *(ulong *)(storage + (uVar11 >> 3)) =
           (ulong)cmd_bits[uVar21] << ((byte)uVar11 & 7) | (ulong)storage[uVar11 >> 3];
      *storage_ix = uVar25;
      uVar11 = (-1L << ((byte)uVar5 & 0x3f)) + (uVar17 - 0x42);
      if (uVar11 >> ((byte)uVar5 & 0x3f) != 0) goto LAB_0011d345;
      *(ulong *)(storage + (uVar25 >> 3)) =
           uVar11 << ((byte)uVar25 & 7) | (ulong)storage[uVar25 >> 3];
      uVar25 = uVar5 + uVar25;
      goto LAB_0011cd4b;
    }
    bVar1 = cmd_depth[0x3d];
    if (cmd_bits[0x3d] >> (bVar1 & 0x3f) != 0) goto LAB_0011d345;
    if (0x38 < bVar1) goto LAB_0011d35e;
    uVar11 = *storage_ix;
    uVar21 = uVar11 + bVar1;
    uVar25 = uVar11 + bVar1 + 0xc;
    *(ulong *)(storage + (uVar11 >> 3)) =
         (ulong)cmd_bits[0x3d] << ((byte)uVar11 & 7) | (ulong)storage[uVar11 >> 3];
    *storage_ix = uVar21;
    *(ulong *)(storage + (uVar21 >> 3)) =
         uVar17 - 0x842 << ((byte)uVar21 & 7) | (ulong)storage[uVar21 >> 3];
    *storage_ix = uVar25;
    puVar8 = cmd_histo + 0x15;
  }
  *puVar8 = *puVar8 + 1;
  for (uVar21 = 0; uVar17 != uVar21; uVar21 = uVar21 + 1) {
    bVar1 = lit_depth[*(byte *)((long)__s1 + uVar21)];
    if (lit_bits[*(byte *)((long)__s1 + uVar21)] >> (bVar1 & 0x3f) != 0) goto LAB_0011d345;
    if (0x38 < bVar1) goto LAB_0011d35e;
    *(ulong *)(storage + (uVar25 >> 3)) =
         (ulong)lit_bits[*(byte *)((long)__s1 + uVar21)] << ((byte)uVar25 & 7) |
         (ulong)storage[uVar25 >> 3];
    uVar25 = uVar25 + bVar1;
    *storage_ix = uVar25;
  }
LAB_0011d04d:
  begin = plVar28;
  if (local_5a0 == (uint8_t *)0x0) {
    if (is_last != 0) {
      uVar17 = *storage_ix;
      *(ulong *)(storage + (uVar17 >> 3)) = (ulong)storage[uVar17 >> 3] | 1L << ((byte)uVar17 & 7);
      uVar21 = uVar17 + 1;
      *storage_ix = uVar21;
      *(ulong *)(storage + (uVar21 >> 3)) = (ulong)storage[uVar21 >> 3] | 1L << ((byte)uVar21 & 7);
      *storage_ix = (ulong)((int)uVar17 + 9U & 0xfffffff8);
      return;
    }
    *cmd_code = '\0';
    *cmd_code_numbits = 0;
    BuildAndStoreCommandPrefixCode(cmd_histo,cmd_depth,cmd_bits,cmd_code_numbits,cmd_code);
    return;
  }
  local_580 = (uint8_t *)0x18000;
  if (local_5a0 < (uint8_t *)0x18000) {
    local_580 = local_5a0;
  }
  uVar21 = *storage_ix;
  BrotliStoreMetaBlockHeader((size_t)local_580,0,storage_ix,storage);
  uVar17 = *storage_ix;
  uVar11 = uVar17 >> 3;
  *(ulong *)(storage + uVar11) = (ulong)storage[uVar11];
  *storage_ix = uVar17 + 0xd;
  local_590 = BuildAndStoreLiteralPrefixCode
                        (m,(uint8_t *)begin,(size_t)local_580,lit_depth,lit_bits,storage_ix,storage)
  ;
  BuildAndStoreCommandPrefixCode(cmd_histo,cmd_depth,cmd_bits,storage_ix,storage);
  input_size = (size_t)local_5a0;
  goto LAB_0011bb30;
}

Assistant:

void BrotliCompressFragmentFast(
    MemoryManager* m, const uint8_t* input, size_t input_size,
    BROTLI_BOOL is_last, int* table, size_t table_size, uint8_t cmd_depth[128],
    uint16_t cmd_bits[128], size_t* cmd_code_numbits, uint8_t* cmd_code,
    size_t* storage_ix, uint8_t* storage) {
  const size_t table_bits = Log2FloorNonZero(table_size);
  switch (table_bits) {
#define CASE_(B)                                                     \
    case B:                                                          \
      BrotliCompressFragmentFastImpl ## B(                           \
          m, input, input_size, is_last, table, cmd_depth, cmd_bits, \
          cmd_code_numbits, cmd_code, storage_ix, storage);          \
      break;
    FOR_TABLE_BITS_(CASE_)
#undef CASE_
    default: assert(0); break;
  }
}